

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

fp __thiscall fmt::v6::detail::normalize<0>(detail *this,fp value)

{
  fp fVar1;
  int offset;
  uint64_t shifted_implicit_bit;
  fp value_local;
  
  value_local.f._0_4_ = (int)value.f;
  for (shifted_implicit_bit = (uint64_t)this; (shifted_implicit_bit & 0x10000000000000) == 0;
      shifted_implicit_bit = shifted_implicit_bit << 1) {
    value_local.f._0_4_ = (int)value_local.f + -1;
  }
  fVar1.f = shifted_implicit_bit << 0xb;
  fVar1.e = (int)value_local.f + -0xb;
  fVar1._12_4_ = 0;
  return fVar1;
}

Assistant:

fp normalize(fp value) {
  // Handle subnormals.
  const auto shifted_implicit_bit = fp::implicit_bit << SHIFT;
  while ((value.f & shifted_implicit_bit) == 0) {
    value.f <<= 1;
    --value.e;
  }
  // Subtract 1 to account for hidden bit.
  const auto offset =
      fp::significand_size - fp::double_significand_size - SHIFT - 1;
  value.f <<= offset;
  value.e -= offset;
  return value;
}